

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

CBlockIndex * __thiscall Chainstate::FindMostWorkChain(Chainstate *this)

{
  _Rb_tree_header *p_Var1;
  set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *this_00;
  uint uVar2;
  pointer ppCVar3;
  int iVar4;
  long lVar5;
  ChainstateManager *pCVar6;
  CBlockIndex *pCVar7;
  CBlockIndex *pCVar8;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<CBlockIndex_*>,_std::_Rb_tree_iterator<CBlockIndex_*>_> pVar9;
  pair<CBlockIndex_*,_CBlockIndex_*> local_58;
  CBlockIndex *local_48;
  CBlockIndex *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header;
  if (p_Var1 == (_Rb_tree_header *)
                (this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
     ) {
    pCVar7 = (CBlockIndex *)0x0;
  }
  else {
    this_00 = &this->setBlockIndexCandidates;
    do {
      lVar5 = std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var1);
      pCVar7 = *(CBlockIndex **)(lVar5 + 0x20);
      local_40 = pCVar7;
      if (pCVar7 == (CBlockIndex *)0x0) break;
      ppCVar3 = (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      while( true ) {
        iVar4 = local_40->nHeight;
        if ((long)iVar4 < 0) {
          pCVar8 = (CBlockIndex *)0x0;
        }
        else {
          pCVar8 = (CBlockIndex *)0x0;
          if (iVar4 < (int)((ulong)((long)(this->m_chain).vChain.
                                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3
                                   ) >> 3)) {
            pCVar8 = ppCVar3[iVar4];
          }
        }
        if (pCVar8 == local_40) goto LAB_00add5e7;
        if ((iVar4 != 0) && (local_40->m_chain_tx_count == 0)) {
          __assert_fail("pindexTest->HaveNumChainTxs() || pindexTest->nHeight == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0xcb2,"CBlockIndex *Chainstate::FindMostWorkChain()");
        }
        uVar2 = local_40->nStatus;
        if ((uVar2 & 0x68) != 8) break;
        local_40 = local_40->pprev;
        if (local_40 == (CBlockIndex *)0x0) goto LAB_00add5e7;
      }
      if ((uVar2 & 0x60) != 0) {
        pCVar6 = this->m_chainman;
        if (pCVar6->m_best_invalid != (CBlockIndex *)0x0) {
          iVar4 = base_uint<256U>::CompareTo
                            (&(pCVar7->nChainWork).super_base_uint<256U>,
                             &(pCVar6->m_best_invalid->nChainWork).super_base_uint<256U>);
          if (iVar4 < 1) goto LAB_00add5ad;
          pCVar6 = this->m_chainman;
        }
        pCVar6->m_best_invalid = pCVar7;
      }
LAB_00add5ad:
      while (local_48 = pCVar7, local_40 != pCVar7) {
        if ((uVar2 & 0x60) == 0) {
          if ((uVar2 & 8) == 0) {
            local_58.first = pCVar7->pprev;
            local_58.second = pCVar7;
            std::
            _Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
            ::_M_emplace_equal<std::pair<CBlockIndex*,CBlockIndex*>>
                      ((_Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                        *)&this->m_blockman->m_blocks_unlinked,&local_58);
          }
        }
        else {
          *(byte *)&pCVar7->nStatus = (byte)pCVar7->nStatus | 0x40;
          std::
          _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
          ::_M_insert_unique<CBlockIndex*const&>
                    ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                      *)&this->m_blockman->m_dirty_blockindex,&local_48);
        }
        pVar9 = std::
                _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                ::equal_range(&this_00->_M_t,&local_48);
        std::
        _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node
                      );
        pCVar7 = local_48->pprev;
      }
      pVar9 = std::
              _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
              ::equal_range(&this_00->_M_t,&local_40);
      std::
      _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
      pCVar7 = (CBlockIndex *)0x0;
    } while (p_Var1 != (_Rb_tree_header *)
                       (this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left);
  }
LAB_00add5e7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pCVar7;
}

Assistant:

CBlockIndex* Chainstate::FindMostWorkChain()
{
    AssertLockHeld(::cs_main);
    do {
        CBlockIndex *pindexNew = nullptr;

        // Find the best candidate header.
        {
            std::set<CBlockIndex*, CBlockIndexWorkComparator>::reverse_iterator it = setBlockIndexCandidates.rbegin();
            if (it == setBlockIndexCandidates.rend())
                return nullptr;
            pindexNew = *it;
        }

        // Check whether all blocks on the path between the currently active chain and the candidate are valid.
        // Just going until the active chain is an optimization, as we know all blocks in it are valid already.
        CBlockIndex *pindexTest = pindexNew;
        bool fInvalidAncestor = false;
        while (pindexTest && !m_chain.Contains(pindexTest)) {
            assert(pindexTest->HaveNumChainTxs() || pindexTest->nHeight == 0);

            // Pruned nodes may have entries in setBlockIndexCandidates for
            // which block files have been deleted.  Remove those as candidates
            // for the most work chain if we come across them; we can't switch
            // to a chain unless we have all the non-active-chain parent blocks.
            bool fFailedChain = pindexTest->nStatus & BLOCK_FAILED_MASK;
            bool fMissingData = !(pindexTest->nStatus & BLOCK_HAVE_DATA);
            if (fFailedChain || fMissingData) {
                // Candidate chain is not usable (either invalid or missing data)
                if (fFailedChain && (m_chainman.m_best_invalid == nullptr || pindexNew->nChainWork > m_chainman.m_best_invalid->nChainWork)) {
                    m_chainman.m_best_invalid = pindexNew;
                }
                CBlockIndex *pindexFailed = pindexNew;
                // Remove the entire chain from the set.
                while (pindexTest != pindexFailed) {
                    if (fFailedChain) {
                        pindexFailed->nStatus |= BLOCK_FAILED_CHILD;
                        m_blockman.m_dirty_blockindex.insert(pindexFailed);
                    } else if (fMissingData) {
                        // If we're missing data, then add back to m_blocks_unlinked,
                        // so that if the block arrives in the future we can try adding
                        // to setBlockIndexCandidates again.
                        m_blockman.m_blocks_unlinked.insert(
                            std::make_pair(pindexFailed->pprev, pindexFailed));
                    }
                    setBlockIndexCandidates.erase(pindexFailed);
                    pindexFailed = pindexFailed->pprev;
                }
                setBlockIndexCandidates.erase(pindexTest);
                fInvalidAncestor = true;
                break;
            }
            pindexTest = pindexTest->pprev;
        }
        if (!fInvalidAncestor)
            return pindexNew;
    } while(true);
}